

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigInteger.cpp
# Opt level: O0

XMLCh * xercesc_4_0::XMLBigInteger::getCanonicalRepresentation
                  (XMLCh *rawData,MemoryManager *memMgr,bool param_3)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NumberFormatException *anon_var_0;
  XMLCh *retBuffer;
  undefined1 local_50 [4];
  int sign;
  ArrayJanitor<char16_t> jan;
  XMLCh *retBuf;
  bool param_2_local;
  MemoryManager *memMgr_local;
  XMLCh *rawData_local;
  char16_t *toDelete;
  
  XVar2 = XMLString::stringLen(rawData);
  iVar1 = (*memMgr->_vptr_MemoryManager[3])(memMgr,XVar2 * 2 + 4);
  toDelete = (char16_t *)CONCAT44(extraout_var,iVar1);
  ArrayJanitor<char16_t>::ArrayJanitor((ArrayJanitor<char16_t> *)local_50,toDelete,memMgr);
  retBuffer._4_4_ = 0;
  parseBigInteger(rawData,toDelete,(int *)((long)&retBuffer + 4),XMLPlatformUtils::fgMemoryManager);
  if (retBuffer._4_4_ == 0) {
    *toDelete = L'0';
    toDelete[1] = L'\0';
  }
  else if (retBuffer._4_4_ == -1) {
    XVar2 = XMLString::stringLen(toDelete);
    iVar1 = (*memMgr->_vptr_MemoryManager[3])(memMgr,XVar2 * 2 + 4);
    rawData_local = (XMLCh *)CONCAT44(extraout_var_00,iVar1);
    *rawData_local = L'-';
    XMLString::copyString(rawData_local + 1,toDelete);
    goto LAB_002bd97f;
  }
  ArrayJanitor<char16_t>::release((ArrayJanitor<char16_t> *)local_50);
  rawData_local = toDelete;
LAB_002bd97f:
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_50);
  return rawData_local;
}

Assistant:

XMLCh* XMLBigInteger::getCanonicalRepresentation(const XMLCh*         const rawData
                                               ,       MemoryManager* const memMgr
                                               ,       bool           /*      isNonPositiveInteger */)
{
    try 
    {
        XMLCh* retBuf = (XMLCh*) memMgr->allocate( (XMLString::stringLen(rawData) + 2) * sizeof(XMLCh));
        ArrayJanitor<XMLCh> jan(retBuf, memMgr);
        int    sign = 0;

        XMLBigInteger::parseBigInteger(rawData, retBuf, sign);

        if (sign == 0)
        {
           retBuf[0] = chDigit_0;
           retBuf[1] = chNull;           
        }
        else if (sign == -1)
        {
            XMLCh* retBuffer = (XMLCh*) memMgr->allocate( (XMLString::stringLen(retBuf) + 2) * sizeof(XMLCh));
            retBuffer[0] = chDash;
            XMLString::copyString(&(retBuffer[1]), retBuf);
            return retBuffer;
        }

        jan.release();
        return retBuf;

    }
    catch (const NumberFormatException&)
    {
        return 0;
    }

}